

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

Move * move_dup(Move *move)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  MOVETYPE MVar4;
  SPOTTYPE SVar5;
  SPOTTYPE SVar6;
  uchar uVar7;
  Move *pMVar8;
  MovePack *pMVar9;
  
  MVar4 = move->type;
  SVar5 = move->fromSpotType;
  uVar1 = move->fromSpotIndex;
  iVar2 = move->fromSpotCardIndex;
  SVar6 = move->toSpotType;
  uVar7 = move->toSpotIndex;
  iVar3 = move->toSpotCardIndex;
  pMVar8 = (Move *)malloc(0x18);
  pMVar8->type = MVar4;
  pMVar8->fromSpotType = SVar5;
  pMVar8->fromSpotIndex = uVar1;
  pMVar8->fromSpotCardIndex = iVar2;
  pMVar8->toSpotType = SVar6;
  pMVar8->toSpotIndex = uVar7;
  pMVar8->toSpotCardIndex = iVar3;
  pMVar8->movePack = (_MovePack *)0x0;
  if (move->movePack != (MovePack *)0x0) {
    pMVar9 = movePack_dup(move->movePack);
    pMVar8->movePack = pMVar9;
  }
  return pMVar8;
}

Assistant:

Move * move_dup(Move * move)
{
	Move * dupMove = move_create(move->type, move->fromSpotType, move->fromSpotIndex, move->fromSpotCardIndex, move->toSpotType, move->toSpotIndex, move->toSpotCardIndex);
	if(move->movePack!=0)
		dupMove->movePack = movePack_dup(move->movePack);
	return dupMove;
}